

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deFilePath.cpp
# Opt level: O3

void de::FilePath_selfTest(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  bool bVar5;
  int iVar6;
  long *plVar7;
  size_type *psVar8;
  long *plVar9;
  long *__s2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_f0;
  FilePath local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  long *local_90;
  size_t local_88;
  long local_80;
  long lStack_78;
  FilePath local_70;
  FilePath local_50;
  
  paVar1 = &local_f0.field_2;
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,".","");
  bVar5 = FilePath::isAbsolutePath((FilePath *)&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if (bVar5) {
    deAssertFail("!FilePath(\".\").isAbsolutePath()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deFilePath.cpp"
                 ,0xd8);
  }
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"..\\foo","");
  bVar5 = FilePath::isAbsolutePath((FilePath *)&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if (bVar5) {
    deAssertFail("!FilePath(\"..\\\\foo\").isAbsolutePath()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deFilePath.cpp"
                 ,0xd9);
  }
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"foo","");
  bVar5 = FilePath::isAbsolutePath((FilePath *)&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if (bVar5) {
    deAssertFail("!FilePath(\"foo\").isAbsolutePath()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deFilePath.cpp"
                 ,0xda);
  }
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"\\foo/bar","");
  bVar5 = FilePath::isAbsolutePath((FilePath *)&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if (!bVar5) {
    deAssertFail("FilePath(\"\\\\foo/bar\").isAbsolutePath()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deFilePath.cpp"
                 ,0xdb);
  }
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"/foo","");
  bVar5 = FilePath::isAbsolutePath((FilePath *)&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if (!bVar5) {
    deAssertFail("FilePath(\"/foo\").isAbsolutePath()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deFilePath.cpp"
                 ,0xdc);
  }
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"\\","");
  bVar5 = FilePath::isAbsolutePath((FilePath *)&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if (!bVar5) {
    deAssertFail("FilePath(\"\\\\\").isAbsolutePath()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deFilePath.cpp"
                 ,0xdd);
  }
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"\\\\net\\loc","");
  bVar5 = FilePath::isAbsolutePath((FilePath *)&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if (!bVar5) {
    deAssertFail("FilePath(\"\\\\\\\\net\\\\loc\").isAbsolutePath()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deFilePath.cpp"
                 ,0xde);
  }
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"C:\\file.txt","");
  bVar5 = FilePath::isAbsolutePath((FilePath *)&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if (!bVar5) {
    deAssertFail("FilePath(\"C:\\\\file.txt\").isAbsolutePath()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deFilePath.cpp"
                 ,0xdf);
  }
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"c:/file.txt","");
  bVar5 = FilePath::isAbsolutePath((FilePath *)&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if (!bVar5) {
    deAssertFail("FilePath(\"c:/file.txt\").isAbsolutePath()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deFilePath.cpp"
                 ,0xe0);
  }
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,".","");
  paVar2 = &local_d0.m_path.field_2;
  local_d0.m_path._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,".//.","");
  FilePath::normalize(&local_d0);
  iVar6 = std::__cxx11::string::compare((char *)&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.m_path._M_dataplus._M_p != paVar2) {
    operator_delete(local_d0.m_path._M_dataplus._M_p,
                    local_d0.m_path.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if (iVar6 != 0) {
    deAssertFail("string(\".\") == FilePath(\".//.\").normalize().getPath()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deFilePath.cpp"
                 ,0xe2);
  }
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,".","");
  local_d0.m_path._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,".","");
  FilePath::normalize(&local_d0);
  iVar6 = std::__cxx11::string::compare((char *)&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.m_path._M_dataplus._M_p != paVar2) {
    operator_delete(local_d0.m_path._M_dataplus._M_p,
                    local_d0.m_path.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if (iVar6 != 0) {
    deAssertFail("string(\".\") == FilePath(\".\").normalize().getPath()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deFilePath.cpp"
                 ,0xe3);
  }
  local_90 = &local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"..","");
  plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_90,FilePath::separator_abi_cxx11_)
  ;
  psVar8 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_d0.m_path.field_2._M_allocated_capacity = *psVar8;
    local_d0.m_path.field_2._8_8_ = plVar7[3];
    local_d0.m_path._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_d0.m_path.field_2._M_allocated_capacity = *psVar8;
    local_d0.m_path._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_d0.m_path._M_string_length = plVar7[1];
  *plVar7 = (long)psVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_d0);
  psVar8 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_f0.field_2._M_allocated_capacity = *psVar8;
    local_f0.field_2._8_4_ = (undefined4)plVar7[3];
    local_f0.field_2._12_4_ = *(undefined4 *)((long)plVar7 + 0x1c);
    local_f0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_f0.field_2._M_allocated_capacity = *psVar8;
    local_f0._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_f0._M_string_length = plVar7[1];
  *plVar7 = (long)psVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  paVar3 = &local_b0.field_2;
  local_b0._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"foo/../bar/../../test","");
  FilePath::normalize((FilePath *)&local_b0);
  iVar6 = std::__cxx11::string::compare((char *)&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar3) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.m_path._M_dataplus._M_p != paVar2) {
    operator_delete(local_d0.m_path._M_dataplus._M_p,
                    local_d0.m_path.field_2._M_allocated_capacity + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if (iVar6 != 0) {
    deAssertFail("(string(\"..\") + FilePath::separator + \"test\") == FilePath(\"foo/../bar/../../test\").normalize().getPath()"
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deFilePath.cpp"
                 ,0xe4);
  }
  local_90 = &local_80;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,FilePath::separator_abi_cxx11_,
             DAT_00b5ac80 + FilePath::separator_abi_cxx11_);
  std::__cxx11::string::append((char *)&local_90);
  plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_90,FilePath::separator_abi_cxx11_)
  ;
  psVar8 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_d0.m_path.field_2._M_allocated_capacity = *psVar8;
    local_d0.m_path.field_2._8_8_ = plVar7[3];
    local_d0.m_path._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_d0.m_path.field_2._M_allocated_capacity = *psVar8;
    local_d0.m_path._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_d0.m_path._M_string_length = plVar7[1];
  *plVar7 = (long)psVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_d0);
  psVar8 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_f0.field_2._M_allocated_capacity = *psVar8;
    local_f0.field_2._8_4_ = (undefined4)plVar7[3];
    local_f0.field_2._12_4_ = *(undefined4 *)((long)plVar7 + 0x1c);
    local_f0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_f0.field_2._M_allocated_capacity = *psVar8;
    local_f0._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_f0._M_string_length = plVar7[1];
  *plVar7 = (long)psVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_b0._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,"/foo\\bar/..\\dir\\..\\foo.txt","");
  FilePath::normalize((FilePath *)&local_b0);
  iVar6 = std::__cxx11::string::compare((char *)&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar3) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.m_path._M_dataplus._M_p != paVar2) {
    operator_delete(local_d0.m_path._M_dataplus._M_p,
                    local_d0.m_path.field_2._M_allocated_capacity + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if (iVar6 != 0) {
    deAssertFail("(FilePath::separator + \"foo\" + FilePath::separator + \"foo.txt\") == FilePath(\"/foo\\\\bar/..\\\\dir\\\\..\\\\foo.txt\").normalize().getPath()"
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deFilePath.cpp"
                 ,0xe5);
  }
  local_70.m_path._M_dataplus._M_p = (pointer)&local_70.m_path.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"c:","");
  plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_70,FilePath::separator_abi_cxx11_)
  ;
  psVar8 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_b0.field_2._M_allocated_capacity = *psVar8;
    local_b0.field_2._8_8_ = plVar7[3];
    local_b0._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_b0.field_2._M_allocated_capacity = *psVar8;
    local_b0._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_b0._M_string_length = plVar7[1];
  *plVar7 = (long)psVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_b0);
  plVar9 = plVar7 + 2;
  if ((long *)*plVar7 == plVar9) {
    local_80 = *plVar9;
    lStack_78 = plVar7[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar9;
    local_90 = (long *)*plVar7;
  }
  local_88 = plVar7[1];
  *plVar7 = (long)plVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_90,FilePath::separator_abi_cxx11_)
  ;
  psVar8 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_d0.m_path.field_2._M_allocated_capacity = *psVar8;
    local_d0.m_path.field_2._8_8_ = plVar7[3];
    local_d0.m_path._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_d0.m_path.field_2._M_allocated_capacity = *psVar8;
    local_d0.m_path._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_d0.m_path._M_string_length = plVar7[1];
  *plVar7 = (long)psVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_d0);
  psVar8 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_f0.field_2._M_allocated_capacity = *psVar8;
    local_f0.field_2._8_4_ = (undefined4)plVar7[3];
    local_f0.field_2._12_4_ = *(undefined4 *)((long)plVar7 + 0x1c);
    local_f0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_f0.field_2._M_allocated_capacity = *psVar8;
    local_f0._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_f0._M_string_length = plVar7[1];
  *plVar7 = (long)psVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  paVar4 = &local_50.m_path.field_2;
  local_50.m_path._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"c:/foo\\bar/..\\dir\\..\\foo.txt","");
  FilePath::normalize(&local_50);
  iVar6 = std::__cxx11::string::compare((char *)&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.m_path._M_dataplus._M_p != paVar4) {
    operator_delete(local_50.m_path._M_dataplus._M_p,
                    local_50.m_path.field_2._M_allocated_capacity + 1);
  }
  paVar4 = &local_70.m_path.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.m_path._M_dataplus._M_p != paVar2) {
    operator_delete(local_d0.m_path._M_dataplus._M_p,
                    local_d0.m_path.field_2._M_allocated_capacity + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar3) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.m_path._M_dataplus._M_p != paVar4) {
    operator_delete(local_70.m_path._M_dataplus._M_p,
                    local_70.m_path.field_2._M_allocated_capacity + 1);
  }
  if (iVar6 != 0) {
    deAssertFail("(string(\"c:\") + FilePath::separator + \"foo\" + FilePath::separator + \"foo.txt\") == FilePath(\"c:/foo\\\\bar/..\\\\dir\\\\..\\\\foo.txt\").normalize().getPath()"
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deFilePath.cpp"
                 ,0xe6);
  }
  std::operator+(&local_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &FilePath::separator_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &FilePath::separator_abi_cxx11_);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_b0);
  plVar9 = plVar7 + 2;
  if ((long *)*plVar7 == plVar9) {
    local_80 = *plVar9;
    lStack_78 = plVar7[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar9;
    local_90 = (long *)*plVar7;
  }
  local_88 = plVar7[1];
  *plVar7 = (long)plVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_90,FilePath::separator_abi_cxx11_)
  ;
  psVar8 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_d0.m_path.field_2._M_allocated_capacity = *psVar8;
    local_d0.m_path.field_2._8_8_ = plVar7[3];
    local_d0.m_path._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_d0.m_path.field_2._M_allocated_capacity = *psVar8;
    local_d0.m_path._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_d0.m_path._M_string_length = plVar7[1];
  *plVar7 = (long)psVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_d0);
  psVar8 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_f0.field_2._M_allocated_capacity = *psVar8;
    local_f0.field_2._8_4_ = (undefined4)plVar7[3];
    local_f0.field_2._12_4_ = *(undefined4 *)((long)plVar7 + 0x1c);
    local_f0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_f0.field_2._M_allocated_capacity = *psVar8;
    local_f0._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_f0._M_string_length = plVar7[1];
  *plVar7 = (long)psVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_70.m_path._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"\\\\foo\\bar/..\\dir\\..\\foo.txt","");
  FilePath::normalize(&local_70);
  iVar6 = std::__cxx11::string::compare((char *)&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.m_path._M_dataplus._M_p != paVar4) {
    operator_delete(local_70.m_path._M_dataplus._M_p,
                    local_70.m_path.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.m_path._M_dataplus._M_p != paVar2) {
    operator_delete(local_d0.m_path._M_dataplus._M_p,
                    local_d0.m_path.field_2._M_allocated_capacity + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar3) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if (iVar6 != 0) {
    deAssertFail("(FilePath::separator + FilePath::separator + \"foo\" + FilePath::separator + \"foo.txt\") == FilePath(\"\\\\\\\\foo\\\\bar/..\\\\dir\\\\..\\\\foo.txt\").normalize().getPath()"
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deFilePath.cpp"
                 ,0xe7);
  }
  local_d0.m_path._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"foo/bar","");
  FilePath::getBaseName_abi_cxx11_(&local_f0,&local_d0);
  iVar6 = std::__cxx11::string::compare((char *)&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.m_path._M_dataplus._M_p != paVar2) {
    operator_delete(local_d0.m_path._M_dataplus._M_p,
                    local_d0.m_path.field_2._M_allocated_capacity + 1);
  }
  if (iVar6 != 0) {
    deAssertFail("FilePath(\"foo/bar\" ).getBaseName() == \"bar\"",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deFilePath.cpp"
                 ,0xe9);
  }
  local_d0.m_path._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"foo/bar/","");
  FilePath::getBaseName_abi_cxx11_(&local_f0,&local_d0);
  iVar6 = std::__cxx11::string::compare((char *)&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.m_path._M_dataplus._M_p != paVar2) {
    operator_delete(local_d0.m_path._M_dataplus._M_p,
                    local_d0.m_path.field_2._M_allocated_capacity + 1);
  }
  if (iVar6 != 0) {
    deAssertFail("FilePath(\"foo/bar/\" ).getBaseName() == \"bar\"",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deFilePath.cpp"
                 ,0xea);
  }
  local_d0.m_path._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"foo\\bar","");
  FilePath::getBaseName_abi_cxx11_(&local_f0,&local_d0);
  iVar6 = std::__cxx11::string::compare((char *)&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.m_path._M_dataplus._M_p != paVar2) {
    operator_delete(local_d0.m_path._M_dataplus._M_p,
                    local_d0.m_path.field_2._M_allocated_capacity + 1);
  }
  if (iVar6 != 0) {
    deAssertFail("FilePath(\"foo\\\\bar\" ).getBaseName() == \"bar\"",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deFilePath.cpp"
                 ,0xeb);
  }
  local_d0.m_path._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"foo\\bar\\","");
  FilePath::getBaseName_abi_cxx11_(&local_f0,&local_d0);
  iVar6 = std::__cxx11::string::compare((char *)&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.m_path._M_dataplus._M_p != paVar2) {
    operator_delete(local_d0.m_path._M_dataplus._M_p,
                    local_d0.m_path.field_2._M_allocated_capacity + 1);
  }
  if (iVar6 != 0) {
    deAssertFail("FilePath(\"foo\\\\bar\\\\\" ).getBaseName() == \"bar\"",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deFilePath.cpp"
                 ,0xec);
  }
  local_d0.m_path._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"foo/bar","");
  FilePath::getDirName_abi_cxx11_(&local_f0,&local_d0);
  iVar6 = std::__cxx11::string::compare((char *)&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.m_path._M_dataplus._M_p != paVar2) {
    operator_delete(local_d0.m_path._M_dataplus._M_p,
                    local_d0.m_path.field_2._M_allocated_capacity + 1);
  }
  if (iVar6 != 0) {
    deAssertFail("FilePath(\"foo/bar\" ).getDirName() == \"foo\"",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deFilePath.cpp"
                 ,0xed);
  }
  local_d0.m_path._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"foo/bar/","");
  FilePath::getDirName_abi_cxx11_(&local_f0,&local_d0);
  iVar6 = std::__cxx11::string::compare((char *)&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.m_path._M_dataplus._M_p != paVar2) {
    operator_delete(local_d0.m_path._M_dataplus._M_p,
                    local_d0.m_path.field_2._M_allocated_capacity + 1);
  }
  if (iVar6 != 0) {
    deAssertFail("FilePath(\"foo/bar/\" ).getDirName() == \"foo\"",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deFilePath.cpp"
                 ,0xee);
  }
  local_d0.m_path._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"foo\\bar","");
  FilePath::getDirName_abi_cxx11_(&local_f0,&local_d0);
  iVar6 = std::__cxx11::string::compare((char *)&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.m_path._M_dataplus._M_p != paVar2) {
    operator_delete(local_d0.m_path._M_dataplus._M_p,
                    local_d0.m_path.field_2._M_allocated_capacity + 1);
  }
  if (iVar6 != 0) {
    deAssertFail("FilePath(\"foo\\\\bar\" ).getDirName() == \"foo\"",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deFilePath.cpp"
                 ,0xef);
  }
  local_d0.m_path._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"foo\\bar\\","");
  FilePath::getDirName_abi_cxx11_(&local_f0,&local_d0);
  iVar6 = std::__cxx11::string::compare((char *)&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.m_path._M_dataplus._M_p != paVar2) {
    operator_delete(local_d0.m_path._M_dataplus._M_p,
                    local_d0.m_path.field_2._M_allocated_capacity + 1);
  }
  if (iVar6 != 0) {
    deAssertFail("FilePath(\"foo\\\\bar\\\\\" ).getDirName() == \"foo\"",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deFilePath.cpp"
                 ,0xf0);
  }
  local_d0.m_path._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"/foo/bar/baz","");
  FilePath::getDirName_abi_cxx11_(&local_f0,&local_d0);
  local_70.m_path._M_dataplus._M_p = (pointer)&local_70.m_path.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,FilePath::separator_abi_cxx11_,
             DAT_00b5ac80 + FilePath::separator_abi_cxx11_);
  std::__cxx11::string::append((char *)&local_70);
  plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_70,FilePath::separator_abi_cxx11_)
  ;
  psVar8 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_b0.field_2._M_allocated_capacity = *psVar8;
    local_b0.field_2._8_8_ = plVar7[3];
    local_b0._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_b0.field_2._M_allocated_capacity = *psVar8;
    local_b0._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_b0._M_string_length = plVar7[1];
  *plVar7 = (long)psVar8;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_b0);
  plVar9 = plVar7 + 2;
  if ((long *)*plVar7 == plVar9) {
    local_80 = *plVar9;
    lStack_78 = plVar7[3];
    __s2 = &local_80;
  }
  else {
    local_80 = *plVar9;
    __s2 = (long *)*plVar7;
  }
  local_88 = plVar7[1];
  *plVar7 = (long)plVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_90 = __s2;
  if (local_f0._M_string_length == local_88) {
    if (local_88 == 0) {
      bVar5 = true;
    }
    else {
      iVar6 = bcmp(local_f0._M_dataplus._M_p,__s2,local_88);
      bVar5 = iVar6 == 0;
    }
  }
  else {
    bVar5 = false;
  }
  if (__s2 != &local_80) {
    operator_delete(__s2,local_80 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar3) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.m_path._M_dataplus._M_p != &local_70.m_path.field_2) {
    operator_delete(local_70.m_path._M_dataplus._M_p,
                    local_70.m_path.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.m_path._M_dataplus._M_p != paVar2) {
    operator_delete(local_d0.m_path._M_dataplus._M_p,
                    local_d0.m_path.field_2._M_allocated_capacity + 1);
  }
  if (!bVar5) {
    deAssertFail("FilePath(\"/foo/bar/baz\" ).getDirName() == FilePath::separator + \"foo\" + FilePath::separator + \"bar\""
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deFilePath.cpp"
                 ,0xf1);
  }
  return;
}

Assistant:

bool FilePath::beginsWithDrive (void) const
{
	for (int ndx = 0; ndx < (int)m_path.length(); ndx++)
	{
		if (m_path[ndx] == ':' && ndx+1 < (int)m_path.length() && isSeparator(m_path[ndx+1]))
			return true; // First part is drive letter.
		if (isSeparator(m_path[ndx]))
			return false;
	}
	return false;
}